

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O2

void ColorPhiWeb(VmInstruction *inst,uint color)

{
  VmValue *pVVar1;
  VmInstruction *pVVar2;
  VmInstructionType VVar3;
  VmValue **ppVVar4;
  VmInstruction *pVVar5;
  VmValueType index;
  VmInstruction *pVVar6;
  uint userPos;
  uint argument;
  uint uVar7;
  uint index_00;
  
  if (inst->color == 0) {
    inst->color = color;
    VVar3 = inst->cmd;
    if (VVar3 == VM_INST_PHI) {
      for (uVar7 = 0; uVar7 < (inst->arguments).count; uVar7 = uVar7 + 2) {
        ppVVar4 = SmallArray<VmValue_*,_4U>::operator[](&inst->arguments,uVar7);
        pVVar6 = (VmInstruction *)*ppVVar4;
        if ((pVVar6 == (VmInstruction *)0x0) || ((pVVar6->super_VmValue).typeID != 2)) {
          pVVar6 = (VmInstruction *)0x0;
        }
        ColorPhiWeb(pVVar6,color);
      }
      VVar3 = inst->cmd;
    }
    if (VVar3 == VM_INST_MOV) {
      ppVVar4 = SmallArray<VmValue_*,_4U>::operator[](&inst->arguments,0);
      pVVar6 = (VmInstruction *)*ppVVar4;
      if ((pVVar6 == (VmInstruction *)0x0) || ((pVVar6->super_VmValue).typeID != 2)) {
        pVVar6 = (VmInstruction *)0x0;
      }
      ColorPhiWeb(pVVar6,color);
      VVar3 = inst->cmd;
    }
    if (VVar3 == VM_INST_DEF) {
      for (uVar7 = 0; uVar7 < (inst->super_VmValue).users.count; uVar7 = uVar7 + 1) {
        ppVVar4 = SmallArray<VmValue_*,_8U>::operator[](&(inst->super_VmValue).users,uVar7);
        pVVar1 = *ppVVar4;
        if (((pVVar1 != (VmValue *)0x0) && (pVVar1->typeID == 2)) &&
           (*(int *)&pVVar1[1]._vptr_VmValue == 0x51)) {
          for (index = VM_TYPE_VOID; index < pVVar1[1].type.type; index = index + VM_TYPE_DOUBLE) {
            ppVVar4 = SmallArray<VmValue_*,_4U>::operator[]
                                ((SmallArray<VmValue_*,_4U> *)&pVVar1[1].typeID,index);
            pVVar6 = (VmInstruction *)*ppVVar4;
            if ((pVVar6 == (VmInstruction *)0x0) || ((pVVar6->super_VmValue).typeID != 2)) {
              pVVar6 = (VmInstruction *)0x0;
            }
            ppVVar4 = SmallArray<VmValue_*,_4U>::operator[]
                                ((SmallArray<VmValue_*,_4U> *)&pVVar1[1].typeID,index + VM_TYPE_INT)
            ;
            pVVar5 = (VmInstruction *)*ppVVar4;
            if ((pVVar5 == (VmInstruction *)0x0) || ((pVVar5->super_VmValue).typeID != 2)) {
              if (pVVar6 != (VmInstruction *)0x0) {
                __assert_fail("source",
                              "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                              ,7000,"void ColorPhiWeb(VmInstruction *, unsigned int)");
              }
LAB_0025a496:
              __assert_fail("destination",
                            "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                            ,6999,"void ColorPhiWeb(VmInstruction *, unsigned int)");
            }
            if (pVVar6 == (VmInstruction *)0x0) goto LAB_0025a496;
            if (pVVar6 == inst) {
              ColorPhiWeb(pVVar5,color);
            }
          }
        }
      }
    }
    for (uVar7 = 0; uVar7 < (inst->super_VmValue).users.count; uVar7 = uVar7 + 1) {
      ppVVar4 = SmallArray<VmValue_*,_8U>::operator[](&(inst->super_VmValue).users,uVar7);
      pVVar6 = (VmInstruction *)*ppVVar4;
      if ((pVVar6 == (VmInstruction *)0x0) || ((pVVar6->super_VmValue).typeID != 2)) {
        pVVar6 = (VmInstruction *)0x0;
      }
      VVar3 = pVVar6->cmd;
      if (VVar3 == VM_INST_PHI) {
        ColorPhiWeb(pVVar6,color);
        VVar3 = pVVar6->cmd;
      }
      if (VVar3 == VM_INST_MOV) {
        ColorPhiWeb(pVVar6,color);
        VVar3 = pVVar6->cmd;
      }
      if (VVar3 == VM_INST_PARALLEL_COPY) {
        for (index_00 = 0; index_00 < (pVVar6->arguments).count; index_00 = index_00 + 2) {
          ppVVar4 = SmallArray<VmValue_*,_4U>::operator[](&pVVar6->arguments,index_00);
          pVVar5 = (VmInstruction *)*ppVVar4;
          if ((pVVar5 == (VmInstruction *)0x0) || ((pVVar5->super_VmValue).typeID != 2)) {
            pVVar5 = (VmInstruction *)0x0;
          }
          ppVVar4 = SmallArray<VmValue_*,_4U>::operator[](&pVVar6->arguments,index_00 + 1);
          pVVar2 = (VmInstruction *)*ppVVar4;
          if ((pVVar2 == (VmInstruction *)0x0) || ((pVVar2->super_VmValue).typeID != 2)) {
            if (pVVar5 != (VmInstruction *)0x0) {
              __assert_fail("source",
                            "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                            ,0x1b73,"void ColorPhiWeb(VmInstruction *, unsigned int)");
            }
LAB_0025a453:
            __assert_fail("destination",
                          "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                          ,0x1b72,"void ColorPhiWeb(VmInstruction *, unsigned int)");
          }
          if (pVVar5 == (VmInstruction *)0x0) goto LAB_0025a453;
          if (pVVar2 == inst) {
            ColorPhiWeb(pVVar5,color);
          }
        }
      }
    }
  }
  return;
}

Assistant:

void ColorPhiWeb(VmInstruction *inst, unsigned color)
{
	if(inst->color != 0)
		return;

	inst->color = color;

	if(inst->cmd == VM_INST_PHI)
	{
		for(unsigned argument = 0; argument < inst->arguments.size(); argument += 2)
		{
			VmInstruction *instruction = getType<VmInstruction>(inst->arguments[argument]);

			ColorPhiWeb(instruction, color);
		}
	}

	if(inst->cmd == VM_INST_MOV)
	{
		VmInstruction *instruction = getType<VmInstruction>(inst->arguments[0]);

		ColorPhiWeb(instruction, color);
	}

	if(inst->cmd == VM_INST_DEF)
	{
		for(unsigned userPos = 0; userPos < inst->users.size(); userPos++)
		{
			VmInstruction *instruction = getType<VmInstruction>(inst->users[userPos]);

			if(instruction && instruction->cmd == VM_INST_PARALLEL_COPY)
			{
				for(unsigned argumentPos = 0; argumentPos < instruction->arguments.size(); argumentPos += 2)
				{
					VmInstruction *destination = getType<VmInstruction>(instruction->arguments[argumentPos]);
					VmInstruction *source = getType<VmInstruction>(instruction->arguments[argumentPos + 1]);

					assert(destination);
					assert(source);

					if(inst == destination)
						ColorPhiWeb(source, color);
				}
			}
		}
	}

	for(unsigned userPos = 0; userPos < inst->users.size(); userPos++)
	{
		VmInstruction *instruction = getType<VmInstruction>(inst->users[userPos]);

		if(instruction->cmd == VM_INST_PHI)
			ColorPhiWeb(instruction, color);

		if(instruction->cmd == VM_INST_MOV)
			ColorPhiWeb(instruction, color);

		if(instruction->cmd == VM_INST_PARALLEL_COPY)
		{
			for(unsigned argumentPos = 0; argumentPos < instruction->arguments.size(); argumentPos += 2)
			{
				VmInstruction *destination = getType<VmInstruction>(instruction->arguments[argumentPos]);
				VmInstruction *source = getType<VmInstruction>(instruction->arguments[argumentPos + 1]);

				assert(destination);
				assert(source);

				if(inst == source)
					ColorPhiWeb(destination, color);
			}
		}
	}
}